

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

void pty_select_result(int fd,int event)

{
  void *pvVar1;
  PtyFd *ptyfd;
  int local_10;
  int iStack_c;
  char c [1];
  int event_local;
  int fd_local;
  
  local_10 = event;
  iStack_c = fd;
  if (fd == pty_signal_pipe[0]) {
    read(pty_signal_pipe[0],(void *)((long)&ptyfd + 7),1);
    pty_try_wait();
  }
  else {
    pvVar1 = find234(ptyfds,&stack0xfffffffffffffff4,ptyfd_find);
    if (pvVar1 != (void *)0x0) {
      pty_real_select_result(*(Pty **)((long)pvVar1 + 8),iStack_c,local_10,0);
    }
  }
  return;
}

Assistant:

void pty_select_result(int fd, int event)
{
    if (fd == pty_signal_pipe[0]) {
        char c[1];

        if (read(pty_signal_pipe[0], c, 1) <= 0)
            /* ignore error */;
        /* ignore its value; it'll be `x' */

        pty_try_wait();
    } else {
        PtyFd *ptyfd = find234(ptyfds, &fd, ptyfd_find);

        if (ptyfd)
            pty_real_select_result(ptyfd->pty, fd, event, 0);
    }
}